

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O3

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::subscribe
          (moldudp64_session<helix::parity::pmd_handler> *this,string *symbol,size_t max_orders)

{
  pointer pcVar1;
  string local_40;
  
  pcVar1 = (symbol->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + symbol->_M_string_length);
  parity::pmd_handler::subscribe(&this->_handler,&local_40,max_orders);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void moldudp64_session<Handler>::subscribe(const std::string& symbol, size_t max_orders)
{
    _handler.subscribe(symbol, max_orders);
}